

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O1

QLibraryScanResult scanSections(QByteArrayView data,ErrorMaker *error)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  void *pvVar7;
  ulong uVar8;
  size_t sVar9;
  storage_type *psVar10;
  ulong uVar11;
  ulong uVar12;
  storage_type *__s;
  size_t __n;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QLibraryScanResult QVar15;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  long local_100;
  long local_f8;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_80;
  QString local_68;
  QString local_50;
  long local_38;
  
  psVar10 = data.m_data;
  uVar11 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = (ulong)*(ushort *)(psVar10 + 0x3c) * 0x40;
  uVar1 = *(ulong *)(psVar10 + 0x28);
  if ((CARRY8(uVar12,uVar1)) || (uVar11 < uVar12 + uVar1)) {
    QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                    "section table extends past the end of the file",(char *)0x0,-1);
    anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_50);
    scanSections();
  }
  else {
    uVar2 = *(ulong *)(psVar10 + (ulong)*(ushort *)(psVar10 + 0x3e) * 0x40 + 0x18 + uVar1);
    uVar3 = *(ulong *)(psVar10 + (ulong)*(ushort *)(psVar10 + 0x3e) * 0x40 + 0x20 + uVar1);
    if ((CARRY8(uVar2,uVar3)) || (uVar11 < uVar2 + uVar3)) {
      QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                      "section header string table extends past the end of the file",(char *)0x0,-1)
      ;
      anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_50);
      scanSections();
    }
    else {
      bVar14 = *(ushort *)(psVar10 + 0x3c) == 0;
      if (bVar14) {
        local_f8 = 0;
        local_100 = 0;
      }
      else {
        lVar5 = uVar1 + 0x20;
        uVar13 = 0;
        local_100 = 0;
        local_f8 = 0;
        do {
          uVar8 = (ulong)*(uint *)(psVar10 + uVar13 + uVar1);
          __s = (storage_type *)0x0;
          __n = uVar3 - uVar8;
          sVar9 = 0;
          if (uVar8 <= uVar3 && __n != 0) {
            __s = psVar10 + uVar8 + uVar2;
            if (psVar10 == (storage_type *)0x0) {
              sVar9 = 0;
            }
            else {
              pvVar7 = memchr(__s,0,__n);
              sVar9 = (long)pvVar7 - (long)__s;
              if (pvVar7 == (void *)0x0) {
                sVar9 = __n;
              }
            }
          }
          if (__s == (storage_type *)0x0) {
            QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                            "a section name extends past the end of the file",(char *)0x0,-1);
            anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_50);
            scanSections();
LAB_004a6d24:
            bVar4 = false;
            local_f8 = 0;
            local_100 = 0;
          }
          else {
            bVar4 = true;
            if (*(int *)(psVar10 + uVar13 + uVar1 + 4) != 8) {
              if (uVar11 < *(ulong *)(psVar10 + uVar13 + uVar1 + 0x18) +
                           *(ulong *)(psVar10 + uVar13 + lVar5) ||
                  CARRY8(*(ulong *)(psVar10 + uVar13 + uVar1 + 0x18),
                         *(ulong *)(psVar10 + uVar13 + lVar5))) {
                QMetaObject::tr(&local_68,&QLibrary::staticMetaObject,
                                "section contents extend past the end of the file",(char *)0x0,-1);
                anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_68);
                scanSections();
                local_f8 = 0;
                local_100 = 0;
                bVar4 = false;
              }
              else if ((sVar9 == 0xb) &&
                      (rhs.m_data = ".qtmetadata", rhs.m_size = 0xb, lhs.m_data = __s,
                      lhs.m_size = 0xb, bVar6 = QtPrivate::equalStrings(lhs,rhs), bVar4 = true,
                      bVar6)) {
                if (*(ulong *)(psVar10 + uVar13 + lVar5) < 0x10) {
                  QMetaObject::tr(&local_80,&QLibrary::staticMetaObject,
                                  ".qtmetadata section is too small",(char *)0x0,-1);
                  anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_80);
                  scanSections();
                  goto LAB_004a6d24;
                }
                if (*(int *)(psVar10 + *(long *)(psVar10 + uVar13 + uVar1 + 0x18) + 8) == 0x21204154
                    && *(long *)(psVar10 + *(long *)(psVar10 + uVar13 + uVar1 + 0x18)) ==
                       0x41444154454d5451) {
                  if ((*(ulong *)(psVar10 + uVar13 + uVar1 + 8) & 1) != 0) {
                    QMetaObject::tr(&local_b0,&QLibrary::staticMetaObject,
                                    ".qtmetadata section is writable",(char *)0x0,-1);
                    anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_b0);
                    scanSections();
                    goto LAB_004a6eb4;
                  }
                  bVar4 = true;
                  if ((*(ulong *)(psVar10 + uVar13 + uVar1 + 8) & 4) != 0) {
                    QMetaObject::tr(&local_c8,&QLibrary::staticMetaObject,
                                    ".qtmetadata section is executable",(char *)0x0,-1);
                    anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_c8);
                    scanSections();
                    goto LAB_004a6eb4;
                  }
                }
                else {
                  QMetaObject::tr(&local_98,&QLibrary::staticMetaObject,
                                  ".qtmetadata section has incorrect magic",(char *)0x0,-1);
                  anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(error,&local_98);
                  scanSections();
LAB_004a6eb4:
                  bVar4 = false;
                  local_f8 = 0;
                  local_100 = 0;
                }
                if (bVar4) {
                  local_f8 = *(long *)(psVar10 + uVar13 + uVar1 + 0x18) + 0xc;
                  local_100 = *(long *)(psVar10 + uVar13 + lVar5) + -0xc;
                }
                bVar4 = false;
              }
            }
          }
          if (!bVar4) break;
          uVar13 = uVar13 + 0x40;
          bVar14 = uVar12 == uVar13;
        } while (!bVar14);
      }
      if (!bVar14) goto LAB_004a6ef8;
      anon_unknown.dwarf_18ad1e3::ErrorMaker::notfound(error);
    }
  }
  local_f8 = 0;
  local_100 = 0;
LAB_004a6ef8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar15.length = local_100;
    QVar15.pos = local_f8;
    return QVar15;
  }
  __stack_chk_fail();
}

Assistant:

static QLibraryScanResult scanSections(QByteArrayView data, const ErrorMaker &error)
{
    auto header = reinterpret_cast<const T::Ehdr *>(data.data());

    // in order to find the .qtmetadata section, we need to:
    // a) find the section table
    //    it's located at offset header->e_shoff
    // validate it
    T::Word e_shnum = header->e_shnum;
    T::Off offset = e_shnum * sizeof(T::Shdr);          // can't overflow due to size of T::Half
    if (qAddOverflow(offset, header->e_shoff, &offset) || offset > size_t(data.size()))
        return error(QLibrary::tr("section table extends past the end of the file"));

    // b) find the section entry for the section header string table (shstrab)
    //    it's a section whose entry is pointed by e_shstrndx
    auto sections = reinterpret_cast<const T::Shdr *>(data.data() + header->e_shoff);
    auto sections_end = sections + e_shnum;
    auto shdr = sections + header->e_shstrndx;

    // validate the shstrtab
    offset = shdr->sh_offset;
    T::Off shstrtab_size = shdr->sh_size;
    qEDebug << "shstrtab section is located at offset" << offset << "size" << shstrtab_size;
    if (T::Off end; qAddOverflow<T::Off>(offset, shstrtab_size, &end)
            || end > size_t(data.size()))
        return error(QLibrary::tr("section header string table extends past the end of the file"));

    // c) iterate over the sections to find .qtmetadata
    const char *shstrtab_start = data.data() + offset;
    shdr = sections;
    for (int section = 0; shdr != sections_end; ++section, ++shdr) {
        QLatin1StringView name;
        if (shdr->sh_name < shstrtab_size) {
            const char *namestart = shstrtab_start + shdr->sh_name;
            size_t len = qstrnlen(namestart, shstrtab_size - shdr->sh_name);
            name = QLatin1StringView(namestart, len);
        }
        qEDebug << "section" << section << "name" << name << ElfSectionDebug{shdr};

        // sanity check the section
        if (name.isNull())
            return error(QLibrary::tr("a section name extends past the end of the file"));

        // sections aren't allowed to extend past the end of the file, unless
        // they are NOBITS sections
        if (shdr->sh_type == SHT_NOBITS)
            continue;
        if (T::Off end; qAddOverflow(shdr->sh_offset, shdr->sh_size, &end)
                || end > size_t(data.size())) {
            return error(QLibrary::tr("section contents extend past the end of the file"));
        }

        if (name != ".qtmetadata"_L1)
            continue;
        qEDebug << "found .qtmetadata section";
        if (shdr->sh_size < sizeof(QPluginMetaData::MagicHeader))
            return error(QLibrary::tr(".qtmetadata section is too small"));

        if (IncludeValidityChecks) {
            QByteArrayView expectedMagic = QByteArrayView::fromArray(QPluginMetaData::MagicString);
            QByteArrayView actualMagic = data.sliced(shdr->sh_offset, expectedMagic.size());
            if (expectedMagic != actualMagic)
                return error(QLibrary::tr(".qtmetadata section has incorrect magic"));

            if (shdr->sh_flags & SHF_WRITE)
                return error(QLibrary::tr(".qtmetadata section is writable"));
            if (shdr->sh_flags & SHF_EXECINSTR)
                return error(QLibrary::tr(".qtmetadata section is executable"));
        }

        return { qsizetype(shdr->sh_offset + sizeof(QPluginMetaData::MagicString)),
                 qsizetype(shdr->sh_size - sizeof(QPluginMetaData::MagicString)) };
    }

    // section .qtmetadata not found
    return error.notfound();
}